

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O3

void UA_Node_deleteMembersAnyNodeClass(UA_Node *node)

{
  UA_NodeClass UVar1;
  UA_VariableNode *p;
  
  deleteMembers_noInit(node,UA_TYPES + 0x10);
  (node->nodeId).identifier.string.data = (UA_Byte *)0x0;
  (node->nodeId).namespaceIndex = 0;
  *(undefined2 *)&(node->nodeId).field_0x2 = 0;
  (node->nodeId).identifierType = UA_NODEIDTYPE_NUMERIC;
  (node->nodeId).identifier.string.length = 0;
  deleteMembers_noInit(&node->browseName,UA_TYPES + 0x13);
  (node->browseName).name.data = (UA_Byte *)0x0;
  *(undefined8 *)&node->browseName = 0;
  (node->browseName).name.length = 0;
  deleteMembers_noInit(&node->displayName,UA_TYPES + 0x14);
  (node->displayName).text.length = 0;
  (node->displayName).text.data = (UA_Byte *)0x0;
  (node->displayName).locale.length = 0;
  (node->displayName).locale.data = (UA_Byte *)0x0;
  deleteMembers_noInit(&node->description,UA_TYPES + 0x14);
  (node->description).text.length = 0;
  (node->description).text.data = (UA_Byte *)0x0;
  (node->description).locale.length = 0;
  (node->description).locale.data = (UA_Byte *)0x0;
  UA_Array_delete(node->references,node->referencesSize,UA_TYPES + 0x38);
  node->referencesSize = 0;
  node->references = (UA_ReferenceNode *)0x0;
  UVar1 = node->nodeClass;
  if (UVar1 != UA_NODECLASS_VARIABLE) {
    if (UVar1 == UA_NODECLASS_REFERENCETYPE) {
      deleteMembers_noInit(&node[1].nodeId.identifier,UA_TYPES + 0x14);
      *(undefined8 *)&node[1].nodeClass = 0;
      *(undefined8 *)&node[1].browseName = 0;
      node[1].nodeId.identifier.string.length = 0;
      node[1].nodeId.identifier.string.data = (UA_Byte *)0x0;
      return;
    }
    if (UVar1 != UA_NODECLASS_VARIABLETYPE) {
      return;
    }
  }
  deleteMembers_noInit(node + 1,UA_TYPES + 0x10);
  node[1].nodeId.namespaceIndex = 0;
  *(undefined2 *)&node[1].nodeId.field_0x2 = 0;
  node[1].nodeId.identifierType = UA_NODEIDTYPE_NUMERIC;
  node[1].nodeId.identifier.string.length = 0;
  node[1].nodeId.identifier.string.data = (UA_Byte *)0x0;
  UA_Array_delete((void *)node[1].browseName.name.length,*(size_t *)&node[1].browseName,UA_TYPES + 5
                 );
  *(undefined8 *)&node[1].browseName = 0;
  node[1].browseName.name.length = 0;
  if (*(int *)&node[1].browseName.name.data == 0) {
    deleteMembers_noInit(&node[1].displayName,UA_TYPES + 0x16);
    node[1].references = (UA_ReferenceNode *)0x0;
    node[2].nodeId.namespaceIndex = 0;
    *(undefined2 *)&node[2].nodeId.field_0x2 = 0;
    node[2].nodeId.identifierType = UA_NODEIDTYPE_NUMERIC;
    node[1].writeMask = 0;
    node[1].userWriteMask = 0;
    node[1].referencesSize = 0;
    node[1].description.text.length = 0;
    node[1].description.text.data = (UA_Byte *)0x0;
    node[1].description.locale.length = 0;
    node[1].description.locale.data = (UA_Byte *)0x0;
    node[1].displayName.text.length = 0;
    node[1].displayName.text.data = (UA_Byte *)0x0;
    node[1].displayName.locale.length = 0;
    node[1].displayName.locale.data = (UA_Byte *)0x0;
  }
  return;
}

Assistant:

void UA_Node_deleteMembersAnyNodeClass(UA_Node *node) {
    /* delete standard content */
    UA_NodeId_deleteMembers(&node->nodeId);
    UA_QualifiedName_deleteMembers(&node->browseName);
    UA_LocalizedText_deleteMembers(&node->displayName);
    UA_LocalizedText_deleteMembers(&node->description);
    UA_Array_delete(node->references, node->referencesSize,
                    &UA_TYPES[UA_TYPES_REFERENCENODE]);
    node->references = NULL;
    node->referencesSize = 0;

    /* delete unique content of the nodeclass */
    switch(node->nodeClass) {
    case UA_NODECLASS_OBJECT:
        break;
    case UA_NODECLASS_METHOD:
        break;
    case UA_NODECLASS_OBJECTTYPE:
        break;
    case UA_NODECLASS_VARIABLE:
    case UA_NODECLASS_VARIABLETYPE: {
        UA_VariableNode *p = (UA_VariableNode*)node;
        UA_NodeId_deleteMembers(&p->dataType);
        UA_Array_delete(p->arrayDimensions, p->arrayDimensionsSize,
                        &UA_TYPES[UA_TYPES_INT32]);
        p->arrayDimensions = NULL;
        p->arrayDimensionsSize = 0;
        if(p->valueSource == UA_VALUESOURCE_DATA)
            UA_DataValue_deleteMembers(&p->value.data.value);
        break;
    }
    case UA_NODECLASS_REFERENCETYPE: {
        UA_ReferenceTypeNode *p = (UA_ReferenceTypeNode*)node;
        UA_LocalizedText_deleteMembers(&p->inverseName);
        break;
    }
    case UA_NODECLASS_DATATYPE:
        break;
    case UA_NODECLASS_VIEW:
        break;
    default:
        break;
    }
}